

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong extraout_RDX;
  ulong uVar2;
  undefined8 extraout_RDX_00;
  ufile_error error;
  ufile_config cfg;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc < 2) {
    printf(anon_var_dwarf_23);
    exit(1);
  }
  getenv("UFILE_PUBLIC_KEY");
  getenv("UFILE_PRIVATE_KEY");
  printf(anon_var_dwarf_8d);
  iVar1 = ufile_sdk_initialize(1);
  uVar2 = extraout_RDX;
  if ((iVar1 == 0) || (uVar2 = (long)iVar1 % 100 & 0xffffffff, iVar1 / 100 == 2)) {
    printf(anon_var_dwarf_b9,argv[1],uVar2);
    iVar1 = ufile_delete("echotest2",argv[1]);
    if ((iVar1 == 0) || (iVar1 / 100 == 2)) {
      printf(anon_var_dwarf_fb);
    }
    else {
      printf(anon_var_dwarf_e5,extraout_RDX_00,(long)iVar1 % 100 & 0xffffffff);
    }
    ufile_sdk_cleanup();
  }
  else {
    ufile_sdk_cleanup();
    printf(anon_var_dwarf_a3,extraout_RDX);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        printf("请输入一个文件 key!!!");
        exit(1);
    }

    struct ufile_config cfg;
    cfg.public_key = getenv("UFILE_PUBLIC_KEY");
    cfg.private_key = getenv("UFILE_PRIVATE_KEY");
    cfg.bucket_host = "api.ucloud.cn";
    cfg.file_host = "cn-bj.ufileos.com";

    printf("正在初始化 SDK ......\n");
    struct ufile_error error;
    error = ufile_sdk_initialize(cfg, 1);
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("初始化 sdk 失败，错误信息为：%s\n", error.message);
        return 1;
    }
    printf("正在删除文件 %s\n", argv[1]);
    error = ufile_delete("echotest2", argv[1]);
    if(UFILE_HAS_ERROR(error.code)){
        printf("删除文件失败，错误信息为：%s\n", error.message);
    }else{
        printf("删除文件成功\n");
    }
    ufile_sdk_cleanup();
}